

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_1,_-1,_false>,_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>
::mapbase_evaluator(mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
                    *this,XprType *map)

{
  Scalar *pSVar1;
  Index IVar2;
  XprType *map_local;
  mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1,__1,_false>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  *this_local;
  
  evaluator_base<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_1,_-1,_false>_>
  ::evaluator_base((evaluator_base<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1,__1,_false>_>
                    *)this);
  pSVar1 = MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_1,_-1,_false>,_0>
           ::data((MapBase<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1,__1,_false>,_0>
                   *)map);
  this->m_data = pSVar1;
  IVar2 = BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_1,_-1,_false,_true>
          ::innerStride((BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1,__1,_false,_true>
                         *)map);
  variable_if_dynamic<long,_-1>::variable_if_dynamic(&this->m_innerStride,IVar2);
  IVar2 = BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_1,_-1,_false,_true>
          ::outerStride((BlockImpl_dense<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_1,__1,_false,_true>
                         *)map);
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x10,IVar2);
  return;
}

Assistant:

explicit mapbase_evaluator(const XprType& map)
    : m_data(const_cast<PointerType>(map.data())),
      m_innerStride(map.innerStride()),
      m_outerStride(map.outerStride())
  {
    EIGEN_STATIC_ASSERT(EIGEN_IMPLIES(evaluator<Derived>::Flags&PacketAccessBit, internal::inner_stride_at_compile_time<Derived>::ret==1),
                        PACKET_ACCESS_REQUIRES_TO_HAVE_INNER_STRIDE_FIXED_TO_1);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
  }